

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O2

void __thiscall CurrentEvent::CurrentEvent(CurrentEvent *this,double n_current,double n_weight)

{
  double dVar1;
  Clock *this_00;
  
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_setWeight_00134ad0;
  this->current = 0.0;
  this->weight = 0.0;
  (this->super_Event).type = Current;
  this_00 = Clock::getInstance();
  dVar1 = Clock::getCurrentTime(this_00);
  (this->super_Event).eventTime = dVar1;
  this->current = n_current;
  this->weight = n_weight;
  return;
}

Assistant:

CurrentEvent(double n_current, double n_weight) {
        type = EventType::Current;
        eventTime = Clock::getInstance()->getCurrentTime();
        current = n_current;
        weight = n_weight;
    }